

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

float vkt::SpirVAssembly::anon_unknown_5::constructNormalizedFloat
                (deInt32 exponent,deUint32 significand)

{
  double dVar1;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  deInt32 idx;
  float f;
  deUint32 significand_local;
  deInt32 exponent_local;
  
  local_14 = 1.0;
  idx = significand;
  for (local_18 = 0; local_18 < 0x17; local_18 = local_18 + 1) {
    if ((idx & 0x800000U) == 0) {
      local_1c = 0.0;
    }
    else {
      dVar1 = std::ldexp(5.26354424712089e-315,-(local_18 + 1));
      local_1c = SUB84(dVar1,0);
    }
    local_14 = local_1c + local_14;
    idx = idx << 1;
  }
  dVar1 = std::ldexp((double)(ulong)(uint)local_14,exponent);
  return SUB84(dVar1,0);
}

Assistant:

float constructNormalizedFloat (deInt32 exponent, deUint32 significand)
{
	float f = 1.0f;

	for (deInt32 idx = 0; idx < 23; ++idx)
	{
		f += ((significand & 0x800000) == 0) ? 0.f : std::ldexp(1.0f, -(idx + 1));
		significand <<= 1;
	}

	return std::ldexp(f, exponent);
}